

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfTiledInputReadTile(ImfTiledInputFile *in,int dx,int dy,int lx,int ly)

{
  TiledRgbaInputFile *pTVar1;
  ImfTiledInputFile *in_RDI;
  exception *e;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  TiledRgbaInputFile *in_stack_ffffffffffffffd0;
  
  pTVar1 = anon_unknown.dwarf_572a3::infile(in_RDI);
  Imf_3_2::TiledRgbaInputFile::readTile
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             (int)((ulong)pTVar1 >> 0x20),(int)pTVar1);
  return 1;
}

Assistant:

int
ImfTiledInputReadTile (ImfTiledInputFile* in, int dx, int dy, int lx, int ly)
{
    try
    {
        infile (in)->readTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}